

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O3

void dsa_public_blob(ssh_key *key,BinarySink *bs)

{
  BinarySink_put_stringz(bs->binarysink_,"ssh-dss");
  BinarySink_put_mp_ssh2(bs->binarysink_,(mp_int *)key[-5].vt);
  BinarySink_put_mp_ssh2(bs->binarysink_,(mp_int *)key[-4].vt);
  BinarySink_put_mp_ssh2(bs->binarysink_,(mp_int *)key[-3].vt);
  BinarySink_put_mp_ssh2(bs->binarysink_,(mp_int *)key[-2].vt);
  return;
}

Assistant:

static void dsa_public_blob(ssh_key *key, BinarySink *bs)
{
    struct dsa_key *dsa = container_of(key, struct dsa_key, sshk);

    put_stringz(bs, "ssh-dss");
    put_mp_ssh2(bs, dsa->p);
    put_mp_ssh2(bs, dsa->q);
    put_mp_ssh2(bs, dsa->g);
    put_mp_ssh2(bs, dsa->y);
}